

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O0

void __thiscall
BuildWithLogTestImplicitGeneratedOutOfDate2::~BuildWithLogTestImplicitGeneratedOutOfDate2
          (BuildWithLogTestImplicitGeneratedOutOfDate2 *this)

{
  BuildWithLogTestImplicitGeneratedOutOfDate2 *this_local;
  
  ~BuildWithLogTestImplicitGeneratedOutOfDate2(this);
  operator_delete(this,0x4c8);
  return;
}

Assistant:

TEST_F(BuildWithLogTest, ImplicitGeneratedOutOfDate2) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"rule touch-implicit-dep-out\n"
"  command = touch $test_dependency ; sleep 1 ; touch $out\n"
"  generator = 1\n"
"build out.imp: touch-implicit-dep-out | inimp inimp2\n"
"  test_dependency = inimp\n"));
  fs_.Create("inimp", "");
  fs_.Create("out.imp", "");
  fs_.Tick();
  fs_.Create("inimp2", "");
  fs_.Tick();

  string err;

  EXPECT_TRUE(builder_.AddTarget("out.imp", &err));
  EXPECT_FALSE(builder_.AlreadyUpToDate());

  EXPECT_TRUE(builder_.Build(&err));
  EXPECT_TRUE(builder_.AlreadyUpToDate());

  command_runner_.commands_ran_.clear();
  state_.Reset();
  builder_.Cleanup();
  builder_.plan_.Reset();

  EXPECT_TRUE(builder_.AddTarget("out.imp", &err));
  EXPECT_TRUE(builder_.AlreadyUpToDate());
  EXPECT_FALSE(GetNode("out.imp")->dirty());
}